

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O0

void choice_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,bool reload_data,Am_Value *sel_value
               )

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  ostream *poVar4;
  undefined1 local_88 [6];
  Am_Value_Type typ;
  Am_Value_List old_value_list;
  Am_Value_List new_value_list;
  Am_Object old_value_obj;
  Am_Object new_value_obj;
  Am_Value old_value;
  Am_Value new_value;
  bool set_selected;
  Am_Object local_28;
  Am_Object inter;
  Am_Value *sel_value_local;
  bool reload_data_local;
  bool selective_local;
  bool undo_local;
  Am_Object *command_obj_local;
  
  inter.data = (Am_Object_Data *)sel_value;
  Am_Object::Am_Object(&local_28);
  pAVar3 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::operator=(&local_28,pAVar3);
  pAVar3 = Am_Object::Get(&local_28,0xdd,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  Am_Value::Am_Value((Am_Value *)&old_value.value);
  Am_Value::Am_Value((Am_Value *)&new_value_obj);
  Am_Object::Am_Object(&old_value_obj);
  Am_Object::Am_Object((Am_Object *)&new_value_list.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&old_value_list.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_88);
  if (selective) {
    bVar2 = Am_Object::Valid(&local_28);
    if (bVar2) {
      pAVar3 = Am_Object::Peek(&local_28,0x169,0);
      Am_Value::operator=((Am_Value *)&old_value.value,pAVar3);
    }
  }
  else {
    pAVar3 = Am_Object::Peek(command_obj,0x169,0);
    Am_Value::operator=((Am_Value *)&old_value.value,pAVar3);
  }
  if (undo) {
    pAVar3 = Am_Object::Peek(command_obj,0x16c,0);
    Am_Value::operator=((Am_Value *)&new_value_obj,pAVar3);
  }
  else if (reload_data) {
    Am_Value::operator=((Am_Value *)&new_value_obj,sel_value);
  }
  else {
    pAVar3 = Am_Object::Peek(command_obj,0x169,0);
    Am_Value::operator=((Am_Value *)&new_value_obj,pAVar3);
  }
  bVar2 = Am_Value::Valid((Am_Value *)&old_value.value);
  if (bVar2) {
    if (old_value.value.long_value._0_2_ == -0x5fff) {
      Am_Object::operator=(&old_value_obj,(Am_Value *)&old_value.value);
      if ((bVar1) && (bVar2 = Am_Object::Valid(&old_value_obj), bVar2)) {
        Am_Object::Set(&old_value_obj,0x172,false,1);
      }
    }
    else {
      bVar2 = Am_Value_List::Test((Am_Wrapper *)new_value._0_8_);
      if (!bVar2) {
        std::operator<<((ostream *)&std::cerr,"** Amulet Error: Bad type ");
        Am_Print_Type((ostream *)&std::cerr,old_value.value.long_value._0_2_);
        poVar4 = std::operator<<((ostream *)&std::cerr," in VALUE of command ");
        poVar4 = operator<<(poVar4,command_obj);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        Am_Error();
      }
      Am_Value_List::operator=((Am_Value_List *)&old_value_list.item,(Am_Value *)&old_value.value);
      Am_Value_List::Start((Am_Value_List *)&old_value_list.item);
      while (bVar2 = Am_Value_List::Last((Am_Value_List *)&old_value_list.item),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        pAVar3 = Am_Value_List::Get((Am_Value_List *)&old_value_list.item);
        Am_Object::operator=(&old_value_obj,pAVar3);
        if (bVar1) {
          Am_Object::Set(&old_value_obj,0x172,false,1);
        }
        Am_Value_List::Next((Am_Value_List *)&old_value_list.item);
      }
    }
  }
  if (bVar1) {
    bVar1 = Am_Value::Valid((Am_Value *)&new_value_obj);
    if (bVar1) {
      if ((Am_Value_Type)new_value_obj.data == 0xa001) {
        Am_Object::operator=((Am_Object *)&new_value_list.item,(Am_Value *)&new_value_obj);
        bVar1 = Am_Object::Valid((Am_Object *)&new_value_list.item);
        if (bVar1) {
          Am_Object::Set((Am_Object *)&new_value_list.item,0x172,true,1);
        }
      }
      else {
        bVar1 = Am_Value_List::Test((Am_Wrapper *)old_value._0_8_);
        if (!bVar1) {
          std::operator<<((ostream *)&std::cerr,"** Amulet Error: Bad type ");
          Am_Print_Type((ostream *)&std::cerr,(Am_Value_Type)new_value_obj.data);
          poVar4 = std::operator<<((ostream *)&std::cerr," in OLD_VALUE of command ");
          poVar4 = operator<<(poVar4,command_obj);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          Am_Error();
        }
        Am_Value_List::operator=((Am_Value_List *)local_88,(Am_Value *)&new_value_obj);
        Am_Value_List::Start((Am_Value_List *)local_88);
        while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_88), ((bVar1 ^ 0xffU) & 1) != 0) {
          pAVar3 = Am_Value_List::Get((Am_Value_List *)local_88);
          Am_Object::operator=((Am_Object *)&new_value_list.item,pAVar3);
          Am_Object::Set((Am_Object *)&new_value_list.item,0x172,true,1);
          Am_Value_List::Next((Am_Value_List *)local_88);
        }
      }
    }
    else {
      Am_Object::operator=((Am_Object *)&new_value_list.item,&Am_No_Object);
    }
  }
  Am_Object::Set(command_obj,0x16c,(Am_Value *)&old_value.value,0);
  Am_Object::Set(command_obj,0x169,(Am_Value *)&new_value_obj,0);
  Am_Object::Set(command_obj,0x16d,(Am_Value *)&new_value_obj,0);
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    Am_Object::Set(&local_28,0x169,(Am_Value *)&new_value_obj,0);
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_88);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&old_value_list.item);
  Am_Object::~Am_Object((Am_Object *)&new_value_list.item);
  Am_Object::~Am_Object(&old_value_obj);
  Am_Value::~Am_Value((Am_Value *)&new_value_obj);
  Am_Value::~Am_Value((Am_Value *)&old_value.value);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

void
choice_general_undo_redo(Am_Object command_obj, bool undo, bool selective,
                         bool reload_data, Am_Value sel_value)
{
  Am_Object inter;
  inter = command_obj.Get(Am_SAVED_OLD_OWNER);
  bool set_selected = inter.Get(Am_SET_SELECTED);

#ifdef DEBUG
  if (inter.Valid() && Am_Inter_Tracing(inter)) {
    if (selective)
      std::cout << "Selective ";
    if (undo)
      std::cout << "Undo";
    else
      std::cout << "Repeat";
    std::cout << " of command " << command_obj << std::endl << std::flush;
  }
#endif
  // Go through current value and unset any SELECTED slots and then set any
  // in the old value

  // first clear SELECTED for the current values
  Am_Value new_value, old_value;
  Am_Object new_value_obj, old_value_obj;
  Am_Value_List new_value_list, old_value_list;

  if (selective) { // then get current value from the interactor
    if (inter.Valid())
      new_value = inter.Peek(Am_VALUE);
  } else // get current value from the command_obj
    new_value = command_obj.Peek(Am_VALUE);

  if (undo)
    old_value = command_obj.Peek(Am_OLD_VALUE);
  else { // repeat
    //set to new obj or current value of command
    if (reload_data)
      old_value = sel_value;
    else
      old_value = command_obj.Peek(Am_VALUE);
  }

  Am_Value_Type typ = new_value.type;

  if (!new_value.Valid())
    ; //don't do anything if not Valid
  else if (typ == Am_OBJECT) {
    new_value_obj = new_value;
    // have to check since might be a null object
    if (set_selected && new_value_obj.Valid()) {
      Am_REPORT_SET_SEL_VALUE(true, inter, new_value_obj, false);
      new_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
    }
  } else if (Am_Value_List::Test(new_value.value.wrapper_value)) {
    new_value_list = new_value;
    for (new_value_list.Start(); !new_value_list.Last();
         new_value_list.Next()) {
      new_value_obj = new_value_list.Get();
      if (set_selected) {
        Am_REPORT_SET_SEL_VALUE(true, inter, new_value_obj, false);
        //clear all current values
        new_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
      }
    }
  } else {
    std::cerr << "** Amulet Error: Bad type ";
    Am_Print_Type(std::cerr, typ);
    std::cerr << " in VALUE of command " << command_obj << std::endl;
    Am_Error();
  }

  // now set SELECTED for the old_value_objs
  typ = old_value.type;

  if (set_selected) {
    if (!old_value.Valid())
      old_value_obj = Am_No_Object; //all invalids map to zero
    else if (typ == Am_OBJECT) {
      old_value_obj = old_value;
      if (old_value_obj.Valid()) {
        //have to check valid since might be a null object
        Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, true);
        old_value_obj.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
      }
    }
    //// BUG: Need to move add_ref to setter to avoid this annoyance
    else if (Am_Value_List::Test(
                 old_value.value.wrapper_value)) { //then is a list
      old_value_list = old_value;
      for (old_value_list.Start(); !old_value_list.Last();
           old_value_list.Next()) {
        old_value_obj = old_value_list.Get();
        Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, true);
        old_value_obj.Set(Am_SELECTED, true,
                          Am_OK_IF_NOT_THERE); //set all old values
      }
    } else {
      std::cerr << "** Amulet Error: Bad type ";
      Am_Print_Type(std::cerr, typ);
      std::cerr << " in OLD_VALUE of command " << command_obj << std::endl;
      Am_Error();
    }
  }

// swap current and old values, in case undo or undo-the-undo again.

#ifdef DEBUG
  if (Am_Inter_Tracing(Am_INTER_TRACE_SETTING)) {
    report_set_value(inter, Am_OLD_VALUE, command_obj, new_value);
    report_set_value(inter, Am_VALUE, command_obj, old_value);
    report_set_value(inter, Am_VALUE, inter, old_value);
  }
#endif
  command_obj.Set(Am_OLD_VALUE, new_value);
  command_obj.Set(Am_VALUE, old_value);
  command_obj.Set(Am_OBJECT_MODIFIED, old_value);
  // make current interactor have the correct current value
  if (inter.Valid())
    inter.Set(Am_VALUE, old_value);
}